

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<ProjectBuilderSources>::Inserter::insertOne
          (Inserter *this,qsizetype pos,ProjectBuilderSources *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ProjectBuilderSources *pPVar3;
  qsizetype qVar4;
  ProjectBuilderSources *pPVar5;
  undefined8 uVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  
  pPVar3 = this->begin;
  lVar12 = this->size;
  pPVar5 = pPVar3 + lVar12;
  this->end = pPVar5;
  this->last = pPVar3 + lVar12 + -1;
  this->where = pPVar3 + pos;
  lVar12 = lVar12 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar12;
  this->sourceCopyAssign = 1;
  if (0 < lVar12) {
    bVar11 = pPVar5[-1].object_output;
    pPVar5->buildable = pPVar5[-1].buildable;
    pPVar5->object_output = bVar11;
    pDVar7 = pPVar5[-1].key.d.d;
    pcVar8 = pPVar5[-1].key.d.ptr;
    pPVar5[-1].key.d.d = (Data *)0x0;
    pPVar5[-1].key.d.ptr = (char16_t *)0x0;
    (pPVar5->key).d.d = pDVar7;
    (pPVar5->key).d.ptr = pcVar8;
    qVar4 = pPVar5[-1].key.d.size;
    pPVar5[-1].key.d.size = 0;
    (pPVar5->key).d.size = qVar4;
    pDVar7 = pPVar5[-1].group.d.d;
    pcVar8 = pPVar5[-1].group.d.ptr;
    pPVar5[-1].group.d.d = (Data *)0x0;
    pPVar5[-1].group.d.ptr = (char16_t *)0x0;
    (pPVar5->group).d.d = pDVar7;
    (pPVar5->group).d.ptr = pcVar8;
    qVar4 = pPVar5[-1].group.d.size;
    pPVar5[-1].group.d.size = 0;
    (pPVar5->group).d.size = qVar4;
    pDVar7 = pPVar5[-1].compiler.d.d;
    pcVar8 = pPVar5[-1].compiler.d.ptr;
    pPVar5[-1].compiler.d.d = (Data *)0x0;
    pPVar5[-1].compiler.d.ptr = (char16_t *)0x0;
    (pPVar5->compiler).d.d = pDVar7;
    (pPVar5->compiler).d.ptr = pcVar8;
    qVar4 = pPVar5[-1].compiler.d.size;
    pPVar5[-1].compiler.d.size = 0;
    (pPVar5->compiler).d.size = qVar4;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        pPVar5 = this->last;
        *(undefined2 *)(&pPVar5->buildable + lVar12) =
             *(undefined2 *)(&pPVar5[-1].buildable + lVar12);
        puVar1 = (undefined8 *)((long)&(pPVar5->key).d.d + lVar12);
        uVar6 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)pPVar5 + lVar12 + -0x48);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar5->key).d.d + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)((long)pPVar5 + lVar12 + -0x48);
        *puVar1 = uVar6;
        puVar1[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pPVar5->key).d.size + lVar12);
        *(undefined8 *)((long)&(pPVar5->key).d.size + lVar12) =
             *(undefined8 *)((long)pPVar5 + lVar12 + -0x38);
        *(undefined8 *)((long)pPVar5 + lVar12 + -0x38) = uVar6;
        puVar1 = (undefined8 *)((long)&(pPVar5->group).d.d + lVar12);
        uVar6 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)pPVar5 + lVar12 + -0x30);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar5->group).d.d + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)((long)pPVar5 + lVar12 + -0x30);
        *puVar1 = uVar6;
        puVar1[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pPVar5->group).d.size + lVar12);
        *(undefined8 *)((long)&(pPVar5->group).d.size + lVar12) =
             *(undefined8 *)((long)pPVar5 + lVar12 + -0x20);
        *(undefined8 *)((long)pPVar5 + lVar12 + -0x20) = uVar6;
        puVar1 = (undefined8 *)((long)pPVar5 + lVar12 + -0x18);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar5->compiler).d.d + lVar12);
        uVar9 = *puVar2;
        uVar10 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(pPVar5->compiler).d.d + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        puVar1 = (undefined8 *)((long)pPVar5 + lVar12 + -0x18);
        *puVar1 = uVar9;
        puVar1[1] = uVar10;
        uVar6 = *(undefined8 *)((long)&(pPVar5->compiler).d.size + lVar12);
        *(undefined8 *)((long)&(pPVar5->compiler).d.size + lVar12) =
             *(undefined8 *)((long)pPVar5 + lVar12 + -8);
        *(undefined8 *)((long)pPVar5 + lVar12 + -8) = uVar6;
        lVar13 = lVar13 + -1;
        lVar12 = lVar12 + -0x50;
      } while (lVar13 != this->move);
    }
    pPVar5 = this->where;
    bVar11 = t->object_output;
    pPVar5->buildable = t->buildable;
    pPVar5->object_output = bVar11;
    pDVar7 = (pPVar5->key).d.d;
    (pPVar5->key).d.d = (t->key).d.d;
    (t->key).d.d = pDVar7;
    pcVar8 = (pPVar5->key).d.ptr;
    (pPVar5->key).d.ptr = (t->key).d.ptr;
    (t->key).d.ptr = pcVar8;
    qVar4 = (pPVar5->key).d.size;
    (pPVar5->key).d.size = (t->key).d.size;
    (t->key).d.size = qVar4;
    pDVar7 = (pPVar5->group).d.d;
    (pPVar5->group).d.d = (t->group).d.d;
    (t->group).d.d = pDVar7;
    pcVar8 = (pPVar5->group).d.ptr;
    (pPVar5->group).d.ptr = (t->group).d.ptr;
    (t->group).d.ptr = pcVar8;
    qVar4 = (pPVar5->group).d.size;
    (pPVar5->group).d.size = (t->group).d.size;
    (t->group).d.size = qVar4;
    pDVar7 = (pPVar5->compiler).d.d;
    (pPVar5->compiler).d.d = (t->compiler).d.d;
    (t->compiler).d.d = pDVar7;
    pcVar8 = (pPVar5->compiler).d.ptr;
    (pPVar5->compiler).d.ptr = (t->compiler).d.ptr;
    (t->compiler).d.ptr = pcVar8;
    qVar4 = (pPVar5->compiler).d.size;
    (pPVar5->compiler).d.size = (t->compiler).d.size;
    (t->compiler).d.size = qVar4;
    return;
  }
  this->sourceCopyConstruct = 1 - lVar12;
  this->move = 0;
  this->sourceCopyAssign = lVar12;
  bVar11 = t->object_output;
  pPVar5->buildable = t->buildable;
  pPVar5->object_output = bVar11;
  pDVar7 = (t->key).d.d;
  (t->key).d.d = (Data *)0x0;
  (pPVar5->key).d.d = pDVar7;
  pcVar8 = (t->key).d.ptr;
  (t->key).d.ptr = (char16_t *)0x0;
  (pPVar5->key).d.ptr = pcVar8;
  qVar4 = (t->key).d.size;
  (t->key).d.size = 0;
  (pPVar5->key).d.size = qVar4;
  pDVar7 = (t->group).d.d;
  (t->group).d.d = (Data *)0x0;
  (pPVar5->group).d.d = pDVar7;
  pcVar8 = (t->group).d.ptr;
  (t->group).d.ptr = (char16_t *)0x0;
  (pPVar5->group).d.ptr = pcVar8;
  qVar4 = (t->group).d.size;
  (t->group).d.size = 0;
  (pPVar5->group).d.size = qVar4;
  pDVar7 = (t->compiler).d.d;
  (t->compiler).d.d = (Data *)0x0;
  (pPVar5->compiler).d.d = pDVar7;
  pcVar8 = (t->compiler).d.ptr;
  (t->compiler).d.ptr = (char16_t *)0x0;
  (pPVar5->compiler).d.ptr = pcVar8;
  qVar4 = (t->compiler).d.size;
  (t->compiler).d.size = 0;
  (pPVar5->compiler).d.size = qVar4;
  this->size = this->size + 1;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }